

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EOS.cpp
# Opt level: O1

void pele::physics::eos::atomic_weightsCHON<pele::physics::eos::Fuego>(Real *atwCHON)

{
  int iVar1;
  Real *awt;
  long lVar2;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ename;
  Real atw [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  Real local_48 [3];
  
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CKSYME_STR((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  awt = local_48;
  CKAWT(awt);
  atwCHON[2] = 0.0;
  atwCHON[3] = 0.0;
  *atwCHON = 0.0;
  atwCHON[1] = 0.0;
  lVar2 = 0;
  do {
    iVar1 = std::__cxx11::string::compare
                      ((char *)((long)&((local_68.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar2));
    if (iVar1 == 0) {
      *atwCHON = *awt;
    }
    iVar1 = std::__cxx11::string::compare
                      ((char *)((long)&((local_68.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar2));
    if (iVar1 == 0) {
      atwCHON[1] = *awt;
    }
    iVar1 = std::__cxx11::string::compare
                      ((char *)((long)&((local_68.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar2));
    if (iVar1 == 0) {
      atwCHON[2] = *awt;
    }
    iVar1 = std::__cxx11::string::compare
                      ((char *)((long)&((local_68.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar2));
    if (iVar1 == 0) {
      atwCHON[3] = *awt;
    }
    awt = awt + 1;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void
atomic_weightsCHON<Fuego>(amrex::Real atwCHON[])
{
  amrex::Vector<std::string> ename;
  CKSYME_STR(ename);
  amrex::Real atw[NUM_ELEMENTS];
  CKAWT(atw);
  // CHON
  for (int i = 0; i < 4; i++) {
    atwCHON[i] = 0.0;
  }
  for (int i = 0; i < NUM_ELEMENTS; i++) {
    if (ename[i] == "C") {
      atwCHON[0] = atw[i];
    }
    if (ename[i] == "H") {
      atwCHON[1] = atw[i];
    }
    if (ename[i] == "O") {
      atwCHON[2] = atw[i];
    }
    if (ename[i] == "N") {
      atwCHON[3] = atw[i];
    }
  }
}